

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_spell_miss_message(parser *p)

{
  void *pvVar1;
  char *s2;
  char *pcVar2;
  long *local_28;
  monster_spell_level *l;
  monster_spell *s;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    for (local_28 = *(long **)((long)pvVar1 + 0x20); *local_28 != 0; local_28 = (long *)*local_28) {
    }
    pcVar2 = (char *)local_28[6];
    s2 = parser_getstr(p,"text");
    pcVar2 = string_append(pcVar2,s2);
    local_28[6] = (long)pcVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_spell_miss_message(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct monster_spell_level *l;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	l = s->level;
	while (l->next) {
		l = l->next;
	}
	l->miss_message = string_append(l->miss_message, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}